

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::try_combinatorial_encoding(dxt1_endpoint_optimizer *this)

{
  unique_color_vec *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  unsigned_short *puVar4;
  uint j;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  dxt1_endpoint_optimizer *pdVar8;
  uint64 uVar9;
  uint i;
  long lVar10;
  uint i_1;
  ulong uVar11;
  uint k;
  int iVar12;
  uint64 uVar13;
  uint16 packed_color;
  unsigned_short local_36;
  
  if (0xfffffffc < (this->m_unique_colors).m_size - 5) {
    pdVar8 = (dxt1_endpoint_optimizer *)&this->m_unique_colors;
    this_00 = &this->m_temp_unique_colors;
    vector<crnlib::unique_color>::operator=(this_00,(vector<crnlib::unique_color> *)pdVar8);
    uVar1 = (this->m_temp_unique_colors).m_size;
    if (uVar1 == 2) {
      for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
        lVar10 = 0;
        for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
          uVar5 = (int)lVar3 * 8 ^ 8;
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),2.0,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),3.0,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),0.5,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),1.5,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),-1.0,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),2.0,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),-0.5,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),0.5,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),-2.0,
                     (int)this_00->m_p + uVar5);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                     (color_quad_u8 *)((long)&(this_00->m_p->m_color).field_0 + lVar10),-1.0,
                     uVar5 + (int)this_00->m_p);
          pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
          vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          lVar10 = lVar10 + 8;
        }
      }
    }
    else if (uVar1 == 3) {
      lVar3 = 0;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
          if (lVar3 != lVar6) {
            iVar12 = (int)lVar6;
            lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                       &this_00->m_p[lVar10].m_color,1.5,(int)this_00->m_p + iVar12);
            pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
            vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
            lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                       &this_00->m_p[lVar10].m_color,0.6666667,(int)this_00->m_p + iVar12);
            pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
            vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
            lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                       &this_00->m_p[lVar10].m_color,0.33333334,(int)this_00->m_p + iVar12);
            pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
            vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
            lerp_color((dxt1_endpoint_optimizer *)&packed_color,(color_quad_u8 *)pdVar8,
                       &this_00->m_p[lVar10].m_color,-0.5,(int)this_00->m_p + iVar12);
            pdVar8 = (dxt1_endpoint_optimizer *)&packed_color;
            vector<crnlib::unique_color>::push_back(this_00,(unique_color *)&packed_color);
          }
        }
        lVar3 = lVar3 + 8;
      }
    }
    lVar3 = 0;
    vector<unsigned_short>::resize(&this->m_unique_packed_colors,0,false);
    uVar5 = 1;
    for (uVar11 = 0; uVar11 < (this->m_temp_unique_colors).m_size; uVar11 = uVar11 + 1) {
      packed_color = dxt1_block::pack_color
                               ((color_quad_u8 *)
                                ((long)&(((this->m_temp_unique_colors).m_p)->m_color).field_0 +
                                lVar3),true,0x7f);
      puVar4 = (this->m_unique_packed_colors).m_p;
      puVar4 = std::
               __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                         (puVar4,puVar4 + (this->m_unique_packed_colors).m_size,&packed_color);
      if (puVar4 == (this->m_unique_packed_colors).m_p + (this->m_unique_packed_colors).m_size) {
        vector<unsigned_short>::push_back(&this->m_unique_packed_colors,&packed_color);
      }
      lVar3 = lVar3 + 8;
    }
    uVar13 = (this->m_best_solution).m_error;
    uVar9 = 0;
    uVar11 = 0;
    while (uVar13 != 0) {
      uVar2 = (this->m_unique_packed_colors).m_size;
      if (uVar2 - 1 <= uVar11) {
        (this->m_best_solution).m_error = 1;
        uVar9 = 1;
        break;
      }
      for (uVar7 = (ulong)uVar5; (uVar13 != 0 && (uVar7 < uVar2)); uVar7 = uVar7 + 1) {
        puVar4 = (this->m_unique_packed_colors).m_p;
        packed_color = puVar4[uVar11];
        local_36 = puVar4[uVar7];
        evaluate_solution(this,(dxt1_solution_coordinates *)&packed_color,false);
        uVar13 = (this->m_best_solution).m_error;
        uVar2 = (this->m_unique_packed_colors).m_size;
      }
      uVar11 = uVar11 + 1;
      uVar5 = uVar5 + 1;
    }
    uVar7 = 0;
    uVar11 = 1;
    while (uVar9 != 0) {
      uVar5 = (this->m_unique_packed_colors).m_size;
      if (uVar5 - 1 <= uVar7) {
        (this->m_best_solution).m_error = uVar13;
        return;
      }
      iVar12 = (int)uVar11;
      for (; (uVar9 != 0 && (uVar11 < uVar5)); uVar11 = uVar11 + 1) {
        puVar4 = (this->m_unique_packed_colors).m_p;
        packed_color = puVar4[uVar7];
        local_36 = puVar4[uVar11];
        evaluate_solution(this,(dxt1_solution_coordinates *)&packed_color,true);
        uVar9 = (this->m_best_solution).m_error;
        uVar5 = (this->m_unique_packed_colors).m_size;
      }
      uVar7 = uVar7 + 1;
      uVar11 = (ulong)(iVar12 + 1);
    }
  }
  return;
}

Assistant:

inline uint size() const
        {
            return m_size;
        }